

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::VertexIDReferenceShader::VertexIDReferenceShader
          (VertexIDReferenceShader *this)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  VertexIDReferenceShader *this_local;
  
  rr::VertexShader::VertexShader(&this->super_VertexShader,2,1);
  rr::FragmentShader::FragmentShader(&this->super_FragmentShader,1,1);
  (this->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_015938e0;
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_01593900;
  pvVar1 = std::vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>::operator[]
                     (&(this->super_VertexShader).m_inputs,0);
  pvVar1->type = GENERICVECTYPE_FLOAT;
  pvVar1 = std::vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>::operator[]
                     (&(this->super_VertexShader).m_inputs,1);
  pvVar1->type = GENERICVECTYPE_FLOAT;
  pvVar2 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_VertexShader).m_outputs,0);
  pvVar2->type = GENERICVECTYPE_FLOAT;
  pvVar2 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_VertexShader).m_outputs,0);
  pvVar2->flatshade = false;
  pvVar2 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_inputs,0);
  pvVar2->type = GENERICVECTYPE_FLOAT;
  pvVar2 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_inputs,0);
  pvVar2->flatshade = false;
  pvVar3 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_outputs,0);
  pvVar3->type = GENERICVECTYPE_FLOAT;
  return;
}

Assistant:

VertexIDReferenceShader ()
		: rr::VertexShader	(2, 1)		// color and pos in => color out
		, rr::FragmentShader(1, 1)		// color in => color out
	{
		this->rr::VertexShader::m_inputs[0].type		= rr::GENERICVECTYPE_FLOAT;
		this->rr::VertexShader::m_inputs[1].type		= rr::GENERICVECTYPE_FLOAT;

		this->rr::VertexShader::m_outputs[0].type		= rr::GENERICVECTYPE_FLOAT;
		this->rr::VertexShader::m_outputs[0].flatshade	= false;

		this->rr::FragmentShader::m_inputs[0].type		= rr::GENERICVECTYPE_FLOAT;
		this->rr::FragmentShader::m_inputs[0].flatshade	= false;

		this->rr::FragmentShader::m_outputs[0].type		= rr::GENERICVECTYPE_FLOAT;
	}